

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_meta___call(lua_State *L)

{
  CTSize *pCVar1;
  ushort uVar2;
  ushort uVar3;
  CTSize CVar4;
  uint32_t uVar5;
  CType *pCVar6;
  TValue *pTVar7;
  TValue *pTVar8;
  CTInfo CVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  void *pvVar13;
  ulong uVar14;
  TValue *pTVar15;
  long lVar16;
  cTValue *pcVar17;
  GCstr *pGVar18;
  uint uVar19;
  MMS mm;
  cTValue *dp;
  GCstr *name;
  uint uVar20;
  int iVar21;
  CTState *cts;
  CType *pCVar22;
  uint uVar23;
  CType *pCVar24;
  bool bVar25;
  bool bVar26;
  int rcl [2];
  CCallState cc;
  uint local_25c;
  uint local_238 [2];
  cTValue *local_230;
  cTValue local_228 [3];
  uint local_210;
  uint local_20c;
  cTValue *local_208;
  TValue *local_200;
  ulong local_1f8;
  uint local_1f0;
  byte local_1ec;
  char local_1eb;
  byte local_1ea;
  byte local_1e9;
  cTValue local_1e8 [16];
  cTValue local_168 [6];
  cTValue local_138 [33];
  
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0xfc);
  cts->L = L;
  pTVar15 = L->base;
  local_200 = L->top;
  if ((local_200 <= pTVar15) || ((pTVar15->field_2).it != 0xfffffff5)) {
    lj_err_argt(L,1,10);
  }
  uVar12 = (ulong)(pTVar15->u32).lo;
  uVar2 = *(ushort *)(uVar12 + 6);
  uVar11 = (uint)uVar2;
  if (uVar11 == 0x15) {
    uVar11 = *(uint *)(uVar12 + 8);
    mm = MM_new;
    uVar20 = (uint)uVar2;
    goto LAB_0014aeb3;
  }
  cts->L = L;
  pCVar22 = cts->tab;
  pCVar24 = pCVar22 + uVar11;
  if ((pCVar22[uVar11].info & 0xf0000000) == 0x20000000) {
    pCVar1 = &pCVar24->size;
    pCVar24 = pCVar22 + (ushort)pCVar24->info;
    bVar25 = *pCVar1 == 4;
  }
  else {
    bVar25 = false;
  }
  iVar21 = -1;
  uVar11 = (uint)uVar2;
  if ((pCVar24->info & 0xf0000000) == 0x60000000) {
    if (bVar25) {
      local_1f8 = (ulong)*(uint *)(uVar12 + 8);
    }
    else {
      local_1f8 = *(ulong *)(uVar12 + 8);
    }
    memset(local_1e8,0,0xb0);
    uVar3 = (ushort)pCVar24->info;
    pCVar22 = cts->tab + uVar3;
    uVar11 = cts->tab[uVar3].info;
    local_210 = (uint)uVar2;
    if ((uVar11 & 0xf8000000) == 0x38000000) {
      local_25c = 0;
      if ((pCVar22->size != 8) && (pCVar22->size != 0x10)) {
LAB_0014af57:
        lj_err_caller(L,LJ_ERR_FFI_NYICALL);
      }
    }
    else {
      local_25c = 0;
      if ((uVar11 & 0xf4000000) == 0x34000000 || (uVar11 & 0xf0000000) == 0x10000000) {
        CVar9 = pCVar24->info;
        pvVar13 = lj_mem_newgco(cts->L,pCVar22->size + 8);
        *(undefined1 *)((long)pvVar13 + 5) = 10;
        *(short *)((long)pvVar13 + 6) = (short)CVar9;
        pTVar15 = L->top;
        L->top = pTVar15 + 1;
        (pTVar15->u32).lo = (uint32_t)pvVar13;
        (pTVar15->field_2).it = 0xfffffff5;
        if ((pCVar22->info & 0xf0000000) == 0x10000000) {
          local_228[0].u64 = 0;
          iVar21 = ccall_classify_struct(cts,pCVar22,(int *)&local_228[0].u64,0);
          if (iVar21 != 0) {
            local_168[0].u64 = (long)pvVar13 + 8;
            local_1eb = '\x01';
            local_25c = 1;
            goto LAB_0014a80e;
          }
        }
        local_1eb = '\0';
        local_25c = 0;
      }
    }
LAB_0014a80e:
    local_208 = local_168;
    uVar11 = (uint)pCVar24->sib;
    uVar12 = 0;
    if (uVar11 == 0) {
      uVar11 = 0;
    }
    pcVar17 = L->base + 1;
    if (pcVar17 < local_200) {
      uVar20 = 0;
      iVar21 = 1;
      uVar12 = 0;
      do {
        if (uVar11 == 0) {
          if ((pCVar24->info & 0x800000) == 0) goto LAB_0014af8a;
          uVar11 = lj_ccall_ctid_vararg(cts,pcVar17);
          local_20c = 0;
        }
        else {
          local_20c = (uint)cts->tab[uVar11].sib;
          uVar11 = (uint)(ushort)cts->tab[uVar11].info;
        }
        uVar23 = cts->tab[uVar11].info;
        pCVar22 = cts->tab + uVar11;
        uVar11 = pCVar22->size;
        if (uVar23 < 0x10000000) {
          if (8 < uVar11) goto LAB_0014af57;
          bVar25 = (uVar23 >> 0x1a & 1) == 0;
LAB_0014aac4:
          bVar26 = false;
LAB_0014aac7:
          uVar23 = uVar11 + 7 >> 3;
          if (bVar25) {
            if ((0x17 < uVar11 + 7) || (6 < local_25c + uVar23)) {
LAB_0014ab41:
              if (0x30000 < (pCVar22->info & 0xf0000)) {
                uVar11 = -1 << ((byte)(pCVar22->info + 0xd0000 >> 0x10) & 0xf);
                uVar20 = uVar20 + ~uVar11 & uVar11;
              }
              if (uVar20 + uVar23 < 0x21) {
                dp = local_138 + uVar20;
                uVar11 = (uint)uVar12;
                uVar20 = uVar20 + uVar23;
                goto LAB_0014ab9e;
              }
              goto LAB_0014af57;
            }
            dp = local_168 + local_25c;
            local_25c = local_25c + uVar23;
          }
          else {
            uVar11 = uVar23;
            if ((pCVar22->info & 0xf8000000) == 0x38000000) {
              uVar11 = 1;
            }
            uVar11 = uVar11 + (uint)uVar12;
            dp = local_1e8 + uVar12 * 2;
            if (8 < uVar11) goto LAB_0014ab41;
LAB_0014ab9e:
            uVar12 = (ulong)uVar11;
          }
          local_230 = dp;
          lj_cconv_ct_tv(cts,pCVar22,(uint8_t *)&dp->u64,pcVar17,iVar21 << 8);
          if (((pCVar22->info & 0xf4000000) == 0) && (uVar11 = pCVar22->size, uVar11 < 4)) {
            if ((pCVar22->info >> 0x17 & 1) == 0) {
              if (uVar11 == 1) {
                uVar11 = (uint)(char)*(byte *)local_230;
              }
              else {
                uVar11 = (uint)(short)*(ushort *)local_230;
              }
            }
            else if (uVar11 == 1) {
              uVar11 = (uint)*(byte *)local_230;
            }
            else {
              uVar11 = (uint)*(ushort *)local_230;
            }
            *(uint *)local_230 = uVar11;
          }
          if ((bool)(bVar26 & uVar23 == 2)) {
            uVar14 = (ulong)((int)uVar12 - 2);
            if (local_230 == local_1e8 + uVar14 * 2) {
              local_1e8[(ulong)((int)uVar12 - 1) * 2] = local_1e8[uVar14 * 2 + 1];
              local_1e8[uVar14 * 2 + 1].u64 = 0;
            }
          }
        }
        else {
          if ((uVar23 & 0xf8000000) == 0x38000000) {
            bVar25 = false;
            if (uVar11 == 8) goto LAB_0014aac4;
            bVar26 = false;
            if (uVar11 == 0x10) goto LAB_0014aac7;
            goto LAB_0014af57;
          }
          if ((uVar23 & 0xf0000000) != 0x10000000) {
            bVar26 = (uVar23 & 0xf4000000) == 0x34000000;
            bVar25 = !bVar26;
            if (!bVar26) {
              uVar11 = 8;
            }
            goto LAB_0014aac7;
          }
          local_238[0] = 0;
          local_238[1] = 0;
          iVar10 = ccall_classify_struct(cts,pCVar22,(int *)local_238,0);
          if (iVar10 == 0) {
            local_1ec = (byte)uVar20;
            local_1ea = (byte)local_25c;
            local_1e9 = (byte)uVar12;
            local_228[0].u64 = 0;
            local_228[1] = (cTValue)0x0;
            lj_cconv_ct_tv(cts,pCVar22,(uint8_t *)&local_228[0].u64,pcVar17,iVar21 << 8);
            uVar19 = (uint)local_1ea;
            uVar23 = (uint)local_1e9;
            lVar16 = 0;
            do {
              if ((local_238[lVar16] & 1) == 0) {
                if ((local_238[lVar16] & 2) != 0) {
                  if (7 < uVar23) goto LAB_0014aa4a;
                  uVar14 = (ulong)uVar23;
                  uVar23 = uVar23 + 1;
                  local_1e8[uVar14 * 2] = local_228[lVar16];
                }
              }
              else {
                if (5 < uVar19) {
LAB_0014aa4a:
                  uVar14 = (ulong)local_1ec;
                  iVar10 = 2 - (uint)(local_238[1] == 0);
                  uVar23 = iVar10 + (uint)local_1ec;
                  if (uVar23 < 0x21) {
                    local_1ec = (byte)uVar23;
                    memcpy(local_138 + uVar14,local_228,(ulong)(uint)(iVar10 * 8));
                    goto LAB_0014aa86;
                  }
                  iVar10 = 2;
                  goto LAB_0014aab0;
                }
                uVar14 = (ulong)uVar19;
                uVar19 = uVar19 + 1;
                local_168[uVar14] = local_228[lVar16];
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 == 1);
            local_1ea = (byte)uVar19;
            local_1e9 = (byte)uVar23;
LAB_0014aa86:
            uVar20 = (uint)local_1ec;
            local_25c = (uint)local_1ea;
            uVar12 = (ulong)local_1e9;
            iVar10 = 7;
          }
          else {
            iVar10 = 0;
          }
LAB_0014aab0:
          if (iVar10 == 0) {
            bVar25 = true;
            goto LAB_0014aac4;
          }
          if (iVar10 != 7) {
            if (iVar10 == 2) goto LAB_0014af57;
            goto LAB_0014acbc;
          }
        }
        iVar21 = iVar21 + 1;
        pcVar17 = pcVar17 + 1;
        uVar11 = local_20c;
      } while (pcVar17 < local_200);
    }
    else {
      uVar20 = 0;
    }
    if (uVar11 != 0) {
LAB_0014af8a:
      lj_err_caller(L,LJ_ERR_FFI_NUMARG);
    }
    local_1e9 = (byte)uVar12;
    local_1ec = (byte)uVar20;
    local_1f0 = 8;
    if (1 < uVar20) {
      local_1f0 = uVar20 * 8 | 8;
    }
LAB_0014acbc:
    pCVar22 = cts->tab;
    (cts->cb).slot = 0xffffffff;
    lj_vm_ffi_call(&local_1f8);
    if ((cts->cb).slot != 0xffffffff) {
      local_228[0].u64 = local_1f8 | 0xffff000000000000;
      pTVar15 = lj_tab_set(L,cts->miscmap,local_228);
      (pTVar15->field_2).it = 0xfffffffd;
    }
    pCVar6 = cts->tab;
    uVar2 = *(ushort *)((long)pCVar24 + ((long)pCVar6 - (long)pCVar22));
    pCVar24 = pCVar6 + uVar2;
    uVar11 = pCVar6[uVar2].info;
    if ((uVar11 & 0xf0000000) == 0x40000000) {
      uVar12 = 1;
      iVar21 = 0;
LAB_0014ae42:
      bVar25 = SUB81(uVar12,0);
    }
    else if ((uVar11 & 0xf0000000) == 0x10000000) {
      iVar21 = 1;
      uVar12 = 0;
      if (local_1eb != '\0') goto LAB_0014ae42;
      uVar11 = L->top[-1].u32.lo;
      local_238[0] = 0;
      local_238[1] = 0;
      ccall_classify_struct(cts,pCVar24,(int *)local_238,0);
      uVar20 = pCVar24->size;
      lVar16 = 0;
      uVar23 = 0;
      do {
        if ((local_238[lVar16] & 1) == 0) {
          if ((local_238[lVar16] & 2) != 0) {
            pcVar17 = local_1e8 + uVar12 * 2;
            uVar12 = (ulong)((int)uVar12 + 1);
            goto LAB_0014adbf;
          }
        }
        else {
          uVar14 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
          pcVar17 = local_168 + uVar14;
LAB_0014adbf:
          local_228[lVar16] = *pcVar17;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 == 1);
      memcpy((void *)((ulong)uVar11 + 8),local_228,(ulong)uVar20);
      bVar25 = false;
    }
    else {
      if ((uVar11 & 0xf4000000) == 0x4000000) {
LAB_0014ae55:
        local_208 = local_1e8;
      }
      else {
        if ((uVar11 & 0xf4000000) == 0x34000000) {
          CVar4 = pCVar24->size;
          uVar12 = (ulong)L->top[-1].u32.lo;
          *(cTValue *)(uVar12 + 8) = local_1e8[0];
          iVar21 = 1;
          if (CVar4 != 8) {
            *(cTValue *)(uVar12 + 0x10) = local_1e8[2];
          }
          uVar12 = 0;
          goto LAB_0014ae42;
        }
        if ((uVar11 & 0xf8000000) == 0x38000000) goto LAB_0014ae55;
      }
      iVar21 = lj_cconv_tv_ct(cts,pCVar24,0,L->top + -1,(uint8_t *)&local_208->u64);
      bVar25 = iVar21 == 0;
      iVar21 = 1;
    }
    uVar11 = local_210;
    if ((bVar25 == false) &&
       (uVar12 = (ulong)(L->glref).ptr32, *(uint *)(uVar12 + 0x24) <= *(uint *)(uVar12 + 0x20))) {
      lj_gc_step(L);
      uVar11 = local_210;
    }
  }
  if (-1 < iVar21) {
    return iVar21;
  }
  mm = MM_call;
  uVar20 = uVar11;
LAB_0014aeb3:
  uVar23 = cts->tab[uVar11].info;
  if ((uVar23 & 0xf0000000) == 0x20000000) {
    uVar11 = uVar23 & 0xffff;
  }
  pcVar17 = lj_ctype_meta(cts,uVar11,mm);
  if (pcVar17 == (cTValue *)0x0) {
    if (uVar20 != 0x15) {
      pGVar18 = lj_ctype_repr(L,uVar11,name);
      lj_err_callerv(L,LJ_ERR_FFI_BADCALL,pGVar18 + 1);
    }
    lj_cf_ffi_new(L);
    iVar21 = 1;
  }
  else {
    pTVar7 = L->base;
    pTVar8 = L->top;
    uVar5 = *(uint32_t *)((long)pTVar7 + -4);
    pTVar7[-1] = *pcVar17;
    (pTVar8->u32).lo = 0;
    (pTVar8->field_2).it = uVar5;
    pTVar8[1].u32.lo = (uint32_t)L;
    pTVar15 = pTVar8 + 2;
    *(int *)((long)pTVar8 + 0xc) = ((int)pTVar15 - (int)pTVar7) + 2;
    L->top = pTVar15;
    L->base = pTVar15;
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

LJLIB_CF(ffi_meta___call)	LJLIB_REC(cdata_call)
{
  CTState *cts = ctype_cts(L);
  GCcdata *cd = ffi_checkcdata(L, 1);
  CTypeID id = cd->ctypeid;
  CType *ct;
  cTValue *tv;
  MMS mm = MM_call;
  if (cd->ctypeid == CTID_CTYPEID) {
    id = *(CTypeID *)cdataptr(cd);
    mm = MM_new;
  } else {
    int ret = lj_ccall_func(L, cd);
    if (ret >= 0)
      return ret;
  }
  /* Handle ctype __call/__new metamethod. */
  ct = ctype_raw(cts, id);
  if (ctype_isptr(ct->info)) id = ctype_cid(ct->info);
  tv = lj_ctype_meta(cts, id, mm);
  if (tv)
    return lj_meta_tailcall(L, tv);
  else if (mm == MM_call)
    lj_err_callerv(L, LJ_ERR_FFI_BADCALL, strdata(lj_ctype_repr(L, id, NULL)));
  return lj_cf_ffi_new(L);
}